

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void __thiscall
MemoryLeakWarningPlugin::postTestAction
          (MemoryLeakWarningPlugin *this,UtestShell *test,TestResult *result)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  MemoryLeakDetector *in_RDX;
  long in_RDI;
  TestFailure f;
  size_t leaks;
  undefined4 in_stack_ffffffffffffff08;
  MemLeakPeriod in_stack_ffffffffffffff0c;
  MemoryLeakDetector *in_stack_ffffffffffffff10;
  char local_b8 [24];
  SimpleString *in_stack_ffffffffffffff60;
  UtestShell *in_stack_ffffffffffffff68;
  TestFailure *in_stack_ffffffffffffff70;
  undefined1 local_88 [104];
  size_t local_20;
  MemoryLeakDetector *local_18;
  
  local_18 = in_RDX;
  MemoryLeakDetector::stopChecking(*(MemoryLeakDetector **)(in_RDI + 0x28));
  local_20 = MemoryLeakDetector::totalMemoryLeaks
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if ((((*(byte *)(in_RDI + 0x30) & 1) == 0) && (*(size_t *)(in_RDI + 0x38) != local_20)) &&
     (sVar1 = *(size_t *)(in_RDI + 0x40),
     sVar3 = TestResult::getFailureCount((TestResult *)local_18), sVar1 == sVar3)) {
    bVar2 = areNewDeleteOverloaded();
    if (bVar2) {
      MemoryLeakDetector::report(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      SimpleString::SimpleString
                ((SimpleString *)in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      TestFailure::TestFailure
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      SimpleString::~SimpleString((SimpleString *)0x10bb85);
      (*local_18->_vptr_MemoryLeakDetector[0xd])(local_18,local_88);
      TestFailure::~TestFailure((TestFailure *)in_stack_ffffffffffffff10);
    }
    else if (*(long *)(in_RDI + 0x38) != 0) {
      StringFromFormat(local_b8,"Warning: Expected %d leak(s), but leak detection was disabled",
                       (ulong)*(uint *)(in_RDI + 0x38));
      pcVar4 = SimpleString::asCharString((SimpleString *)0x10bc29);
      (*local_18->_vptr_MemoryLeakDetector[0xe])(local_18,pcVar4);
      SimpleString::~SimpleString((SimpleString *)0x10bc4f);
      in_stack_ffffffffffffff10 = local_18;
    }
  }
  MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod(in_stack_ffffffffffffff10);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::postTestAction(UtestShell& test, TestResult& result)
{
    memLeakDetector_->stopChecking();
    size_t leaks = memLeakDetector_->totalMemoryLeaks(mem_leak_period_checking);

    if (!ignoreAllWarnings_ && expectedLeaks_ != leaks && failureCount_ == result.getFailureCount()) {
        if(MemoryLeakWarningPlugin::areNewDeleteOverloaded()) {
            TestFailure f(&test, memLeakDetector_->report(mem_leak_period_checking));
            result.addFailure(f);
        } else if(expectedLeaks_ > 0) {
            result.print(StringFromFormat("Warning: Expected %d leak(s), but leak detection was disabled", (int) expectedLeaks_).asCharString());
        }
    }
    memLeakDetector_->markCheckingPeriodLeaksAsNonCheckingPeriod();
    ignoreAllWarnings_ = false;
    expectedLeaks_ = 0;
}